

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fibonacci.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  istream *piVar2;
  ostream *poVar3;
  int num;
  string line;
  ifstream stream;
  
  std::ifstream::ifstream((istream *)&stream,argv[1],_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&stream,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    num = std::__cxx11::stoi(&line,(size_t *)0x0,10);
    if (-1 < num) {
      iVar1 = genFibonacci(&num);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&stream);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);
//    ifstream stream("/home/arkezar/fib");
    string line;
    int num;
    while (getline(stream, line)) {
        num = stoi(line);
        if(num >= 0){

            cout << genFibonacci(num) << endl;
        }
    }
    return 0;
}